

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

int __thiscall soplex::SPxSteepPR<double>::selectLeaveSparse(SPxSteepPR<double> *this,double tol)

{
  int n;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  char *pcVar4;
  int *piVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  int i;
  int idx;
  int lastIdx;
  double x;
  double best;
  double *fTest;
  double *coWeights_ptr;
  uint local_3c;
  int local_34;
  double local_28;
  
  pdVar1 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e6ad8);
  SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e6af5);
  pdVar3 = (double *)infinity();
  dVar7 = *pdVar3;
  local_34 = -1;
  local_3c = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8));
  uVar6 = extraout_RDX;
  local_28 = -dVar7;
  while (local_3c = local_3c - 1, -1 < (int)local_3c) {
    pcVar4 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_3c,
                           (int)uVar6);
    n = (int)pcVar4;
    if (-in_XMM0_Qa <= pdVar2[n]) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_3c);
      piVar5 = DataArray<int>::operator[]((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x868),n);
      *piVar5 = 0;
      uVar6 = extraout_RDX_01;
    }
    else {
      dVar7 = steeppr::computePrice<double>(pdVar2[n],pdVar1[n],in_XMM0_Qa);
      uVar6 = extraout_RDX_00;
      if (local_28 < dVar7) {
        local_34 = n;
        local_28 = dVar7;
      }
    }
  }
  return local_34;
}

Assistant:

int SPxSteepPR<R>::selectLeaveSparse(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;
   int idx;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         if(x > best)
         {
            best = x;
            lastIdx = idx;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return lastIdx;
}